

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.h
# Opt level: O0

bool __thiscall IDisk::Track::IsBitInACorrectSector(Track *this,uint index,uint *index_end)

{
  bool bVar1;
  reference paVar2;
  anon_struct_36_14_4aa84ee9 *it;
  iterator __end2;
  iterator __begin2;
  vector<IDisk::Sector,_std::allocator<IDisk::Sector>_> *__range2;
  uint *index_end_local;
  uint index_local;
  Track *this_local;
  
  __end2 = std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::begin(&this->list_sector_);
  it = (anon_struct_36_14_4aa84ee9 *)
       std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>::end(&this->list_sector_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<IDisk::Sector_*,_std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>_>
                                *)&it);
    if (!bVar1) {
      return false;
    }
    paVar2 = __gnu_cxx::
             __normal_iterator<IDisk::Sector_*,_std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>_>
             ::operator*(&__end2);
    if (((paVar2->idam_sync_offset <= index) && (index < paVar2->idam_offset + 0xa0)) &&
       (*index_end = paVar2->idam_offset + 0xa0, (paVar2->chrn_crc_ok & 1U) != 0)) break;
    if (((paVar2->dam_sync_offset <= index) && (index < paVar2->index_end)) &&
       (*index_end = paVar2->index_end, (paVar2->data_crc_ok & 1U) != 0)) {
      return true;
    }
    __gnu_cxx::
    __normal_iterator<IDisk::Sector_*,_std::vector<IDisk::Sector,_std::allocator<IDisk::Sector>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool IsBitInACorrectSector(unsigned int index, unsigned int* index_end)
      {
         for (auto& it : list_sector_)
         {
            // 16*12 = sync bytes !
            if (index >= it.idam_sync_offset && index < it.idam_offset + 160)
            {
               // Here
               *index_end = it.idam_offset + 160;
               if (it.chrn_crc_ok) return true;
            }
            if ((index >= it.dam_sync_offset && index < it.index_end)
               /*|| (it->indexEnd < it->DAMOffset && index < it->indexEnd)*/)
            {
               // Here
               *index_end = it.index_end;
               if (it.data_crc_ok) return true;
            }
         }
         return false;
      }